

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::~TextureCubeMipmapTestInstance
          (TextureCubeMipmapTestInstance *this)

{
  ~TextureCubeMipmapTestInstance(this);
  operator_delete(this,0x2a8);
  return;
}

Assistant:

TextureCubeMipmapTestInstance::~TextureCubeMipmapTestInstance (void)
{
}